

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

UChar32 icu_63::findAlgName(AlgorithmicRange *range,UCharNameChoice nameChoice,char *otherName)

{
  char cVar1;
  char cVar2;
  uint32_t uVar3;
  ushort count_00;
  int iVar4;
  AlgorithmicRange *factors_00;
  char *pcVar5;
  ushort local_142;
  char c_1;
  uint16_t idx;
  uint16_t i_1;
  UChar32 limit;
  UChar32 start;
  char *t;
  char *s_1;
  uint16_t count_1;
  uint16_t *factors;
  char *elements [8];
  char *elementBases [8];
  uint16_t indexes [8];
  char buffer [64];
  ushort local_3c;
  uint16_t count;
  uint16_t i;
  AlgorithmicRange *pAStack_38;
  char c;
  char *s;
  char *pcStack_28;
  UChar32 code;
  char *otherName_local;
  UCharNameChoice nameChoice_local;
  AlgorithmicRange *range_local;
  
  if ((nameChoice != U_UNICODE_CHAR_NAME) && (nameChoice != U_EXTENDED_CHAR_NAME)) {
    return 0xffff;
  }
  if (range->type == '\0') {
    pAStack_38 = range + 1;
    pcStack_28 = otherName;
    while( true ) {
      cVar1 = (char)pAStack_38->start;
      if (cVar1 == '\0') break;
      cVar2 = *pcStack_28;
      pAStack_38 = (AlgorithmicRange *)((long)&pAStack_38->start + 1);
      pcStack_28 = pcStack_28 + 1;
      if (cVar1 != cVar2) {
        return 0xffff;
      }
    }
    s._4_4_ = 0;
    for (local_3c = 0; local_3c < range->variant; local_3c = local_3c + 1) {
      cVar1 = *pcStack_28;
      if ((cVar1 < '0') || ('9' < cVar1)) {
        if ((cVar1 < 'A') || ('F' < cVar1)) {
          return 0xffff;
        }
        s._4_4_ = s._4_4_ << 4 | (int)cVar1 - 0x37U;
      }
      else {
        s._4_4_ = s._4_4_ << 4 | (int)cVar1 - 0x30U;
      }
      pcStack_28 = pcStack_28 + 1;
    }
    if (((*pcStack_28 == '\0') && (range->start <= s._4_4_)) && (s._4_4_ <= range->end)) {
      return s._4_4_;
    }
  }
  else if (range->type == '\x01') {
    factors_00 = range + 1;
    count_00 = (ushort)range->variant;
    t = (char *)((long)&factors_00->start + (long)(int)(uint)count_00 * 2);
    pcStack_28 = otherName;
    while( true ) {
      cVar1 = *t;
      if (cVar1 == '\0') break;
      cVar2 = *pcStack_28;
      t = t + 1;
      pcStack_28 = pcStack_28 + 1;
      if (cVar1 != cVar2) {
        return 0xffff;
      }
    }
    _idx = range->start;
    uVar3 = range->end;
    writeFactorSuffix((uint16_t *)factors_00,count_00,t + 1,0,(uint16_t *)(elementBases + 7),
                      elements + 7,(char **)&factors,(char *)(indexes + 4),0x40);
    iVar4 = strcmp(pcStack_28,(char *)(indexes + 4));
    if (iVar4 == 0) {
      return _idx;
    }
    while (_idx = _idx + 1, local_142 = count_00, (int)_idx < (int)(uVar3 + 1)) {
      while( true ) {
        local_142 = local_142 - 1;
        if ((ushort)(indexes[(ulong)local_142 - 4] + 1) <
            *(ushort *)((long)&factors_00->start + (ulong)local_142 * 2)) break;
        indexes[(ulong)local_142 - 4] = 0;
        elements[(ulong)local_142 - 1] = elements[(ulong)local_142 + 7];
      }
      indexes[(ulong)local_142 - 4] = indexes[(ulong)local_142 - 4] + 1;
      t = elements[(ulong)local_142 - 1];
      do {
        pcVar5 = t + 1;
        cVar1 = *t;
        t = pcVar5;
      } while (cVar1 != '\0');
      elements[(ulong)local_142 - 1] = pcVar5;
      _limit = pcStack_28;
      for (local_142 = 0; local_142 < count_00; local_142 = local_142 + 1) {
        t = elements[(ulong)local_142 - 1];
        while( true ) {
          cVar1 = *t;
          if (cVar1 == '\0') break;
          pcVar5 = _limit + 1;
          cVar2 = *_limit;
          _limit = pcVar5;
          t = t + 1;
          if (cVar1 != cVar2) {
            t = "";
            local_142 = 99;
          }
        }
      }
      if ((local_142 < 99) && (*_limit == '\0')) {
        return _idx;
      }
    }
  }
  return 0xffff;
}

Assistant:

static UChar32
findAlgName(AlgorithmicRange *range, UCharNameChoice nameChoice, const char *otherName) {
    UChar32 code;

    if(nameChoice!=U_UNICODE_CHAR_NAME && nameChoice!=U_EXTENDED_CHAR_NAME) {
        return 0xffff;
    }

    switch(range->type) {
    case 0: {
        /* name = prefix hex-digits */
        const char *s=(const char *)(range+1);
        char c;

        uint16_t i, count;

        /* compare prefix */
        while((c=*s++)!=0) {
            if((char)c!=*otherName++) {
                return 0xffff;
            }
        }

        /* read hexadecimal code point value */
        count=range->variant;
        code=0;
        for(i=0; i<count; ++i) {
            c=*otherName++;
            if('0'<=c && c<='9') {
                code=(code<<4)|(c-'0');
            } else if('A'<=c && c<='F') {
                code=(code<<4)|(c-'A'+10);
            } else {
                return 0xffff;
            }
        }

        /* does it fit into the range? */
        if(*otherName==0 && range->start<=(uint32_t)code && (uint32_t)code<=range->end) {
            return code;
        }
        break;
    }
    case 1: {
        char buffer[64];
        uint16_t indexes[8];
        const char *elementBases[8], *elements[8];
        const uint16_t *factors=(const uint16_t *)(range+1);
        uint16_t count=range->variant;
        const char *s=(const char *)(factors+count), *t;
        UChar32 start, limit;
        uint16_t i, idx;

        char c;

        /* name = prefix factorized-elements */

        /* compare prefix */
        while((c=*s++)!=0) {
            if((char)c!=*otherName++) {
                return 0xffff;
            }
        }

        start=(UChar32)range->start;
        limit=(UChar32)(range->end+1);

        /* initialize the suffix elements for enumeration; indexes should all be set to 0 */
        writeFactorSuffix(factors, count, s, 0,
                          indexes, elementBases, elements, buffer, sizeof(buffer));

        /* compare the first suffix */
        if(0==uprv_strcmp(otherName, buffer)) {
            return start;
        }

        /* enumerate and compare the rest of the suffixes */
        while(++start<limit) {
            /* increment the indexes in lexical order bound by the factors */
            i=count;
            for (;;) {
                idx=(uint16_t)(indexes[--i]+1);
                if(idx<factors[i]) {
                    /* skip one index and its element string */
                    indexes[i]=idx;
                    s=elements[i];
                    while(*s++!=0) {}
                    elements[i]=s;
                    break;
                } else {
                    /* reset this index to 0 and its element string to the first one */
                    indexes[i]=0;
                    elements[i]=elementBases[i];
                }
            }

            /* to make matters a little easier, just compare all elements of the suffix */
            t=otherName;
            for(i=0; i<count; ++i) {
                s=elements[i];
                while((c=*s++)!=0) {
                    if(c!=*t++) {
                        s=""; /* does not match */
                        i=99;
                    }
                }
            }
            if(i<99 && *t==0) {
                return start;
            }
        }
        break;
    }
    default:
        /* undefined type */
        break;
    }

    return 0xffff;
}